

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O0

void __thiscall
HighsSearch::setRINSNeighbourhood
          (HighsSearch *this,vector<double,_std::allocator<double>_> *basesol,
          vector<double,_std::allocator<double>_> *relaxsol)

{
  double dVar1;
  int iVar2;
  HighsVarType HVar3;
  HighsInt HVar4;
  reference pvVar5;
  const_reference pvVar6;
  pointer pHVar7;
  Reason *pRVar8;
  double *pdVar9;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  undefined8 *in_RDI;
  vector<double,_std::allocator<double>_> *pvVar10;
  double extraout_XMM0_Qa;
  double intval;
  HighsInt i;
  undefined8 *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  double in_stack_ffffffffffffff88;
  undefined8 *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  Reason in_stack_ffffffffffffffa0;
  double local_28;
  int local_1c;
  vector<double,_std::allocator<double>_> *local_18;
  vector<double,_std::allocator<double>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_1c = 0; iVar2 = local_1c, HVar4 = HighsMipSolver::numCol((HighsMipSolver *)*in_RDI),
      iVar2 != HVar4; local_1c = local_1c + 1) {
    HVar3 = HighsMipSolver::variableType
                      ((HighsMipSolver *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (HighsInt)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    if (HVar3 == kInteger) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 99),(long)local_1c);
      dVar1 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x66),(long)local_1c)
      ;
      if ((dVar1 != *pvVar5) || (NAN(dVar1) || NAN(*pvVar5))) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_10,(long)local_1c);
        local_28 = floor(*pvVar6 + 0.5);
        pvVar10 = local_18;
        std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_1c);
        std::abs((int)pvVar10);
        pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x68f41a);
        if (extraout_XMM0_Qa < pHVar7->feastol) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 99),
                              (long)local_1c);
          if (*pvVar5 < local_28) {
            in_stack_ffffffffffffff90 = in_RDI + 2;
            in_stack_ffffffffffffff9c = local_1c;
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x66),
                                (long)local_1c);
            pRVar8 = (Reason *)std::min<double>(&local_28,pvVar5);
            in_stack_ffffffffffffffa0 = *pRVar8;
            HighsDomain::Reason::unspecified();
            HighsDomain::changeBound
                      ((HighsDomain *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       (HighsBoundType)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                       (HighsInt)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                       in_stack_ffffffffffffffa0);
          }
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x66),
                              (long)local_1c);
          if (local_28 < *pvVar5) {
            in_stack_ffffffffffffff78 = in_RDI + 2;
            in_stack_ffffffffffffff84 = local_1c;
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 99),
                                (long)local_1c);
            pdVar9 = std::max<double>(&local_28,pvVar5);
            in_stack_ffffffffffffff88 = *pdVar9;
            HighsDomain::Reason::unspecified();
            HighsDomain::changeBound
                      ((HighsDomain *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       (HighsBoundType)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                       (HighsInt)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                       in_stack_ffffffffffffffa0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void HighsSearch::setRINSNeighbourhood(const std::vector<double>& basesol,
                                       const std::vector<double>& relaxsol) {
  for (HighsInt i = 0; i != mipsolver.numCol(); ++i) {
    if (mipsolver.variableType(i) != HighsVarType::kInteger) continue;
    if (localdom.col_lower_[i] == localdom.col_upper_[i]) continue;

    double intval = std::floor(basesol[i] + 0.5);
    if (std::abs(relaxsol[i] - intval) < mipsolver.mipdata_->feastol) {
      if (localdom.col_lower_[i] < intval)
        localdom.changeBound(HighsBoundType::kLower, i,
                             std::min(intval, localdom.col_upper_[i]),
                             HighsDomain::Reason::unspecified());
      if (localdom.col_upper_[i] > intval)
        localdom.changeBound(HighsBoundType::kUpper, i,
                             std::max(intval, localdom.col_lower_[i]),
                             HighsDomain::Reason::unspecified());
    }
  }
}